

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool execute(Camera *camera,int x)

{
  Ray *ray;
  undefined1 auVar1 [16];
  undefined8 uVar2;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  float *pfVar3;
  uint uVar4;
  result_type __sd;
  Vector3f col;
  Ray local_68;
  Ray camRay;
  
  __sd = (result_type)x;
  ray = (Ray *)(execute::rt + __sd);
  if (*(long *)(ray->o).m_elements == 0) {
    this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)operator_new(5000);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(this,__sd);
    *(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      **)(ray->o).m_elements = this;
  }
  uVar4 = camera->height;
  while (0 < (int)uVar4) {
    uVar4 = uVar4 - 1;
    (*camera->_vptr_Camera[2])(&camRay,camera,(ulong)(uint)x,(ulong)uVar4,execute::rt[__sd].g);
    Ray::Ray(&local_68,&camRay);
    trace((Runtime *)&col,ray);
    pfVar3 = Vector3f::operator[](&col,0);
    auVar1 = vminss_avx(SUB6416(ZEXT464(0x41200000),0),ZEXT416((uint)*pfVar3));
    auVar1 = vmaxss_avx(ZEXT816(0) << 0x40,auVar1);
    uVar2 = vcmpss_avx512f(auVar1,auVar1,7);
    pfVar3 = Vector3f::operator[](&col,0);
    *pfVar3 = (float)((uint)((byte)uVar2 & 1) * auVar1._0_4_);
    pfVar3 = Vector3f::operator[](&col,1);
    auVar1 = vminss_avx(SUB6416(ZEXT464(0x41200000),0),ZEXT416((uint)*pfVar3));
    auVar1 = vmaxss_avx(ZEXT816(0) << 0x40,auVar1);
    uVar2 = vcmpss_avx512f(auVar1,auVar1,7);
    pfVar3 = Vector3f::operator[](&col,1);
    *pfVar3 = (float)((uint)((byte)uVar2 & 1) * auVar1._0_4_);
    pfVar3 = Vector3f::operator[](&col,2);
    auVar1 = vminss_avx(SUB6416(ZEXT464(0x41200000),0),ZEXT416((uint)*pfVar3));
    auVar1 = vmaxss_avx(ZEXT816(0) << 0x40,auVar1);
    uVar2 = vcmpss_avx512f(auVar1,auVar1,7);
    pfVar3 = Vector3f::operator[](&col,2);
    *pfVar3 = (float)((uint)((byte)uVar2 & 1) * auVar1._0_4_);
    Vector3f::operator+=((Vector3f *)(tot + (ulong)uVar4 * 0xc + __sd * 24000),&col);
  }
  return true;
}

Assistant:

bool execute(Camera* camera, int x)
{
	static Runtime rt[2000];
	if (!rt[x].g)
	{
		rt[x].g = new RNG_TYPE(x);
		/*
		rt[x].davg.resize(scene.mat_num);
		rt[x].favg.resize(scene.mat_num);
		for (auto& x : rt[x].davg) x = 1;
		for (auto& x : rt[x].favg) x = 1;
		*/
	}
	for (int y = int(camera->getHeight() - 1); y >= 0; --y)
	{
		Ray camRay = camera->generateRay(x, y, *rt[x].g);
		Vector3f col = trace(rt[x], camRay);
		auto clamp = [&](float t) {if (t > 10) t = 10; if (t < 0) t = 0; if (t != t) t = 0; return t; };
		col[0] = clamp(col[0]);
		col[1] = clamp(col[1]);
		col[2] = clamp(col[2]);
		tot[x][y] += col;
	}
	return 1;
}